

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> * __thiscall
CLI::App::get_options
          (vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__return_storage_ptr__
          ,App *this,function<bool_(const_CLI::Option_*)> *filter)

{
  pointer puVar1;
  pointer psVar2;
  App *this_00;
  pointer puVar3;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  __first;
  pointer ppOVar4;
  pointer psVar5;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> subcopts;
  _Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_68;
  function<bool_(const_CLI::Option_*)> local_50;
  
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
            (__return_storage_ptr__,
             (long)(this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_68);
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppOVar4 = (__return_storage_ptr__->
            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (puVar3 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    *ppOVar4 = (puVar3->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
               _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ppOVar4 = ppOVar4 + 1;
  }
  if ((filter->super__Function_base)._M_manager != (_Manager_type)0x0) {
    __first = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(CLI::Option_const*)_1_>>
                        ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                          )(__return_storage_ptr__->
                           super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                          )(__return_storage_ptr__->
                           super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish,
                         (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_app_CLI11_hpp:8905:38)>
                          )filter);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::erase
              (__return_storage_ptr__,(const_iterator)__first._M_current,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  }
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1) {
    this_00 = (psVar5->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((this_00->name_)._M_string_length == 0) && ((this_00->group_)._M_string_length != 0)) &&
       (*(this_00->group_)._M_dataplus._M_p == '+')) {
      std::function<bool_(const_CLI::Option_*)>::function(&local_50,filter);
      get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_68,
                  this_00,&local_50);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      ::std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>::
      insert<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,void>
                ((vector<CLI::Option_const*,std::allocator<CLI::Option_const*>> *)
                 __return_storage_ptr__,
                 (const_iterator)
                 (__return_storage_ptr__->
                 super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  )local_68._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  )local_68._M_impl.super__Vector_impl_data._M_finish);
      std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
                (&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::vector<const Option *> App::get_options(const std::function<bool(const Option *)> filter) const {
    std::vector<const Option *> options(options_.size());
    std::transform(
        std::begin(options_), std::end(options_), std::begin(options), [](const Option_p &val) { return val.get(); });

    if(filter) {
        options.erase(std::remove_if(std::begin(options),
                                     std::end(options),
                                     [&filter](const Option *opt) { return !filter(opt); }),
                      std::end(options));
    }
    for(const auto &subcp : subcommands_) {
        // also check down into nameless subcommands
        const App *subc = subcp.get();
        if(subc->get_name().empty() && !subc->get_group().empty() && subc->get_group().front() == '+') {
            std::vector<const Option *> subcopts = subc->get_options(filter);
            options.insert(options.end(), subcopts.begin(), subcopts.end());
        }
    }
    return options;
}